

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf_iterator.h
# Opt level: O0

int cppcms::utf8::trail_length(uchar c)

{
  uchar c_local;
  undefined4 local_4;
  
  if (c < 0x80) {
    local_4 = 0;
  }
  else if (c < 0xc2) {
    local_4 = -1;
  }
  else if (c < 0xe0) {
    local_4 = 1;
  }
  else if (c < 0xf0) {
    local_4 = 2;
  }
  else if (c < 0xf5) {
    local_4 = 3;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

inline int trail_length(unsigned char c) 
        {
            if(c < 128)
                return 0;
            if(c < 194)
                return -1;
            if(c < 224)
                return 1;
            if(c < 240)
                return 2;
            if(c <=244)
                return 3;
            return -1;
        }